

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O2

void * rw::d3d::destroyNativeRaster(void *object,int32 offset,int32 param_3)

{
  if (*(uint *)((long)object + 4) < 6) {
    if ((0x31U >> (*(uint *)((long)object + 4) & 0x1f) & 1) != 0) {
      (*DAT_00145dd0)(*(undefined8 *)((long)object + (long)offset));
    }
  }
  (*DAT_00145dd0)(*(undefined8 *)((long)object + (long)offset + 8));
  return object;
}

Assistant:

static void*
destroyNativeRaster(void *object, int32 offset, int32)
{
	Raster *raster = (Raster*)object;
	D3dRaster *natras = PLUGINOFFSET(D3dRaster, raster, offset);
#ifdef RW_D3D9
	removeVidmemRaster(raster);
	evictD3D9Raster(raster);
#endif
	switch(raster->type){
	case Raster::NORMAL:
	case Raster::TEXTURE:
	case Raster::CAMERATEXTURE:
		destroyTexture(natras->texture);
		break;

	case Raster::ZBUFFER:
#ifdef RW_D3D9
		if(raster->flags & Raster::DONTALLOCATE)
			break;
		if(natras->texture != d3d9Globals.defaultDepthSurf)
			((IDirect3DSurface9*)natras->texture)->Release();
		natras->texture = nil;
#endif
		break;
	case Raster::CAMERA:
		break;
	}
	rwFree(natras->palette);
	return object;
}